

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cpp
# Opt level: O1

Variable *
skiwi::make_variable
          (Variable *__return_storage_ptr__,
          vector<skiwi::token,_std::allocator<skiwi::token>_> *tokens)

{
  int line_nr;
  int column_nr;
  pointer ptVar1;
  vector<skiwi::token,_std::allocator<skiwi::token>_> *in_RDX;
  vector<skiwi::token,_std::allocator<skiwi::token>_> *extraout_RDX;
  vector<skiwi::token,_std::allocator<skiwi::token>_> *extraout_RDX_00;
  vector<skiwi::token,_std::allocator<skiwi::token>_> *extraout_RDX_01;
  string local_70;
  string local_50;
  
  if ((tokens->super__Vector_base<skiwi::token,_std::allocator<skiwi::token>_>)._M_impl.
      super__Vector_impl_data._M_start ==
      (tokens->super__Vector_base<skiwi::token,_std::allocator<skiwi::token>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    anon_unknown_2::throw_parse_error(no_tokens);
    in_RDX = extraout_RDX;
  }
  ptVar1 = (tokens->super__Vector_base<skiwi::token,_std::allocator<skiwi::token>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (((tokens->super__Vector_base<skiwi::token,_std::allocator<skiwi::token>_>)._M_impl.
       super__Vector_impl_data._M_start == ptVar1) || (ptVar1[-1].type != T_ID)) {
    line_nr = ptVar1[-1].line_nr;
    column_nr = ptVar1[-1].column_nr;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
    anon_unknown_2::throw_parse_error(line_nr,column_nr,bad_syntax,&local_70);
    in_RDX = extraout_RDX_00;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      in_RDX = extraout_RDX_01;
    }
  }
  __return_storage_ptr__->line_nr = -1;
  __return_storage_ptr__->column_nr = -1;
  (__return_storage_ptr__->name)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->name).field_2
  ;
  (__return_storage_ptr__->name)._M_string_length = 0;
  (__return_storage_ptr__->name).field_2._M_local_buf[0] = '\0';
  __return_storage_ptr__->tail_position = false;
  __return_storage_ptr__->pre_scan_index = 0;
  __return_storage_ptr__->scan_index = 0;
  (__return_storage_ptr__->filename)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->filename).field_2;
  (__return_storage_ptr__->filename)._M_string_length = 0;
  (__return_storage_ptr__->filename).field_2._M_local_buf[0] = '\0';
  ptVar1 = (tokens->super__Vector_base<skiwi::token,_std::allocator<skiwi::token>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  __return_storage_ptr__->line_nr = ptVar1[-1].line_nr;
  __return_storage_ptr__->column_nr = ptVar1[-1].column_nr;
  (anonymous_namespace)::current_abi_cxx11_(&local_50,(_anonymous_namespace_ *)tokens,in_RDX);
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->name,(string *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  anon_unknown_2::advance(tokens);
  return __return_storage_ptr__;
}

Assistant:

Variable make_variable(std::vector<token>& tokens)
  {
  if (tokens.empty())
    throw_parse_error(no_tokens);
  if (current_type(tokens) != token::T_ID)
    throw_parse_error(tokens.back().line_nr, tokens.back().column_nr, bad_syntax);
  Variable v;
  v.line_nr = tokens.back().line_nr;
  v.column_nr = tokens.back().column_nr;
  v.name = current(tokens);
  advance(tokens);
  return v;
  }